

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

Array<kj::(anonymous_namespace)::TestObject> * __thiscall
kj::Arena::allocateOwnArray<kj::(anonymous_namespace)::TestObject>
          (Array<kj::(anonymous_namespace)::TestObject> *__return_storage_ptr__,Arena *this,
          size_t size)

{
  ArrayDisposer *local_48;
  size_t i;
  ArrayBuilder<kj::(anonymous_namespace)::TestObject> result;
  size_t size_local;
  Arena *this_local;
  
  result.disposer = (ArrayDisposer *)size;
  allocateOwnArrayBuilder<kj::(anonymous_namespace)::TestObject>
            ((ArrayBuilder<kj::(anonymous_namespace)::TestObject> *)&i,this,size);
  for (local_48 = (ArrayDisposer *)0x0; local_48 < result.disposer;
      local_48 = (ArrayDisposer *)((long)&local_48->_vptr_ArrayDisposer + 1)) {
    ArrayBuilder<kj::(anonymous_namespace)::TestObject>::add<>
              ((ArrayBuilder<kj::(anonymous_namespace)::TestObject> *)&i);
  }
  ArrayBuilder<kj::(anonymous_namespace)::TestObject>::finish
            (__return_storage_ptr__,(ArrayBuilder<kj::(anonymous_namespace)::TestObject> *)&i);
  ArrayBuilder<kj::(anonymous_namespace)::TestObject>::~ArrayBuilder
            ((ArrayBuilder<kj::(anonymous_namespace)::TestObject> *)&i);
  return __return_storage_ptr__;
}

Assistant:

Array<T> Arena::allocateOwnArray(size_t size) {
  ArrayBuilder<T> result = allocateOwnArrayBuilder<T>(size);
  for (size_t i = 0; i < size; i++) {
    result.add();
  }
  return result.finish();
}